

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O1

int find_by_flag(png_uint_32 flag)

{
  png_uint_32 pVar1;
  int extraout_EAX;
  long lVar2;
  png_uint_32 *ppVar3;
  
  lVar2 = -0x19;
  ppVar3 = &chunk_info[0x18].flag;
  do {
    if (lVar2 == 0) {
      find_by_flag_cold_1();
      return extraout_EAX;
    }
    lVar2 = lVar2 + 1;
    pVar1 = *ppVar3;
    ppVar3 = ppVar3 + -8;
  } while (pVar1 != flag);
  return -(int)lVar2;
}

Assistant:

static int
find_by_flag(png_uint_32 flag)
{
   int i = NINFO;

   while (--i >= 0)
      if (chunk_info[i].flag == flag)
         return i;

   fprintf(stderr, "pngunknown: internal error\n");
   exit(4);
}